

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O0

uint32_t libtorrent::aux::peer_priority(endpoint *e1,endpoint *e2)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  uint32_t *puVar5;
  int *piVar6;
  int *piVar7;
  pointer __s2;
  pointer pvVar8;
  short *psVar9;
  short *psVar10;
  reference __s2_00;
  reference pvVar11;
  int local_1d4;
  int local_1bc;
  undefined4 local_198;
  undefined4 local_194;
  uint64_t addrbuf_1;
  int mask_1;
  undefined1 local_168 [12];
  bytes_type b2_1;
  undefined1 local_140 [12];
  bytes_type b1_1;
  uint64_t addrbuf [4];
  int mask;
  address_v6 local_e8;
  undefined1 local_d0 [8];
  bytes_type b2;
  address_v6 local_a0;
  undefined1 local_84 [8];
  bytes_type b1;
  uint32_t p;
  pointer ptr;
  array<char,_4UL> buf;
  address local_40;
  uint32_t local_1c;
  endpoint *peStack_18;
  uint32_t ret;
  endpoint *e2_local;
  endpoint *e1_local;
  
  peStack_18 = e2;
  e2_local = e1;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address(&local_40,e1);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
            ((address *)&stack0xffffffffffffffa0,e2);
  bVar1 = boost::asio::ip::operator==(&local_40,(address *)&stack0xffffffffffffffa0);
  if (bVar1) {
    uVar2 = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(e1);
    uVar3 = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(e2);
    if (uVar3 < uVar2) {
      ::std::swap<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(e1,e2);
    }
    register0x00000000 = ::std::array<char,_4UL>::data((array<char,_4UL> *)((long)&ptr + 4));
    uVar2 = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(e1);
    write_uint16<unsigned_short,char*>(uVar2,(char **)(b1._M_elems + 0xc));
    uVar2 = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(e2);
    write_uint16<unsigned_short,char*>(uVar2,(char **)(b1._M_elems + 0xc));
    puVar5 = (uint32_t *)::std::array<char,_4UL>::data((array<char,_4UL> *)((long)&ptr + 4));
    b1._M_elems._8_4_ = *puVar5;
    local_1c = crc32c_32(b1._M_elems._8_4_);
  }
  else {
    bVar1 = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(e1);
    if (bVar1) {
      bVar1 = boost::asio::ip::operator>(e1,e2);
      if (bVar1) {
        ::std::swap<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(e1,e2);
      }
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                ((address *)(b2._M_elems + 8),e1);
      boost::asio::ip::address::to_v6(&local_a0,(address *)(b2._M_elems + 8));
      _local_84 = boost::asio::ip::address_v6::to_bytes(&local_a0);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                ((address *)&stack0xfffffffffffffef8,e2);
      boost::asio::ip::address::to_v6(&local_e8,(address *)&stack0xfffffffffffffef8);
      _local_d0 = boost::asio::ip::address_v6::to_bytes(&local_e8);
      piVar6 = (int *)::std::array<unsigned_char,_16UL>::data
                                ((array<unsigned_char,_16UL> *)local_84);
      piVar7 = (int *)::std::array<unsigned_char,_16UL>::data
                                ((array<unsigned_char,_16UL> *)local_d0);
      if (*piVar6 == *piVar7) {
        pvVar8 = ::std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_84);
        __s2 = ::std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_d0);
        iVar4 = memcmp(pvVar8,__s2,6);
        local_1bc = 2;
        if (iVar4 != 0) {
          local_1bc = 1;
        }
      }
      else {
        local_1bc = 0;
      }
      pvVar8 = ::std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_84);
      anon_unknown_15::apply_mask(pvVar8,peer_priority::v6mask[local_1bc],8);
      pvVar8 = ::std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_d0);
      anon_unknown_15::apply_mask(pvVar8,peer_priority::v6mask[local_1bc],8);
      pvVar8 = ::std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_84);
      unique0x00012000 = *(undefined8 *)pvVar8;
      ::std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)local_d0);
      local_1c = crc32c((uint64_t *)(local_140 + 8),4);
    }
    else {
      bVar1 = boost::asio::ip::operator>(e1,e2);
      if (bVar1) {
        ::std::swap<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(e1,e2);
      }
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address((address *)(local_168 + 8),e1);
      boost::asio::ip::address::to_v4((address *)local_140);
      local_140._4_4_ = boost::asio::ip::address_v4::to_bytes((address_v4 *)local_140);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                ((address *)&stack0xfffffffffffffe78,e2);
      boost::asio::ip::address::to_v4((address *)local_168);
      local_168._4_4_ = boost::asio::ip::address_v4::to_bytes((address_v4 *)local_168);
      psVar9 = (short *)::std::array<unsigned_char,_4UL>::operator[]
                                  ((array<unsigned_char,_4UL> *)(local_140 + 4),0);
      psVar10 = (short *)::std::array<unsigned_char,_4UL>::operator[]
                                   ((array<unsigned_char,_4UL> *)(local_168 + 4),0);
      if (*psVar9 == *psVar10) {
        pvVar11 = ::std::array<unsigned_char,_4UL>::operator[]
                            ((array<unsigned_char,_4UL> *)(local_140 + 4),0);
        __s2_00 = ::std::array<unsigned_char,_4UL>::operator[]
                            ((array<unsigned_char,_4UL> *)(local_168 + 4),0);
        iVar4 = memcmp(pvVar11,__s2_00,3);
        local_1d4 = 2;
        if (iVar4 != 0) {
          local_1d4 = 1;
        }
      }
      else {
        local_1d4 = 0;
      }
      addrbuf_1._4_4_ = local_1d4;
      pvVar11 = ::std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)(local_140 + 4),0);
      anon_unknown_15::apply_mask(pvVar11,peer_priority::v4mask[addrbuf_1._4_4_],4);
      pvVar11 = ::std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)(local_168 + 4),0);
      anon_unknown_15::apply_mask(pvVar11,peer_priority::v4mask[addrbuf_1._4_4_],4);
      pvVar11 = ::std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)(local_140 + 4),0);
      local_198 = *(undefined4 *)pvVar11;
      pvVar11 = ::std::array<unsigned_char,_4UL>::operator[]
                          ((array<unsigned_char,_4UL> *)(local_168 + 4),0);
      local_194 = *(undefined4 *)pvVar11;
      local_1c = crc32c((uint64_t *)&local_198,1);
    }
  }
  return local_1c;
}

Assistant:

std::uint32_t peer_priority(tcp::endpoint e1, tcp::endpoint e2)
	{
		TORRENT_ASSERT(aux::is_v4(e1) == aux::is_v4(e2));

		using std::swap;

		std::uint32_t ret;
		if (e1.address() == e2.address())
		{
			if (e1.port() > e2.port())
				swap(e1, e2);
			std::array<char, 4> buf;
			auto ptr = buf.data();
			aux::write_uint16(e1.port(), ptr);
			aux::write_uint16(e2.port(), ptr);
			std::uint32_t p;
			std::memcpy(&p, buf.data(), 4);
			ret = crc32c_32(p);
		}
		else if (aux::is_v6(e1))
		{
			static const std::uint8_t v6mask[][8] = {
				{ 0xff, 0xff, 0xff, 0xff, 0x55, 0x55, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff }
			};

			if (e1 > e2) swap(e1, e2);
			address_v6::bytes_type b1 = e1.address().to_v6().to_bytes();
			address_v6::bytes_type b2 = e2.address().to_v6().to_bytes();
			int const mask = std::memcmp(b1.data(), b2.data(), 4) ? 0
				: std::memcmp(b1.data(), b2.data(), 6) ? 1 : 2;
			apply_mask(b1.data(), v6mask[mask], 8);
			apply_mask(b2.data(), v6mask[mask], 8);
			std::uint64_t addrbuf[4];
			std::memcpy(&addrbuf[0], b1.data(), 16);
			std::memcpy(&addrbuf[2], b2.data(), 16);
			ret = aux::crc32c(addrbuf, 4);
		}
		else
		{
			static const std::uint8_t v4mask[][4] = {
				{ 0xff, 0xff, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff }
			};

			if (e1 > e2) swap(e1, e2);
			address_v4::bytes_type b1 = e1.address().to_v4().to_bytes();
			address_v4::bytes_type b2 = e2.address().to_v4().to_bytes();
			int mask = std::memcmp(&b1[0], &b2[0], 2) ? 0
				: std::memcmp(&b1[0], &b2[0], 3) ? 1 : 2;
			apply_mask(&b1[0], v4mask[mask], 4);
			apply_mask(&b2[0], v4mask[mask], 4);
			std::uint64_t addrbuf;
			std::memcpy(&addrbuf, &b1[0], 4);
			std::memcpy(reinterpret_cast<char*>(&addrbuf) + 4, &b2[0], 4);
			ret = aux::crc32c(&addrbuf, 1);
		}

		return ret;
	}